

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void applyOverrideCursor(QList<QScreen_*> *screens,QCursor *c)

{
  QScreen **ppQVar1;
  int iVar2;
  QPlatformScreen *pQVar3;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  long *plVar4;
  
  ppQVar1 = QGuiApplicationPrivate::screen_list.d.ptr;
  lVar6 = QGuiApplicationPrivate::screen_list.d.size << 3;
  for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 8) {
    pQVar3 = QScreen::handle(*(QScreen **)((long)ppQVar1 + lVar5));
    iVar2 = (*pQVar3->_vptr_QPlatformScreen[0x16])(pQVar3);
    plVar4 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x70))(plVar4,screens);
    }
  }
  return;
}

Assistant:

static inline void applyOverrideCursor(const QList<QScreen *> &screens, const QCursor &c)
{
    for (QScreen *screen : screens) {
        if (QPlatformCursor *cursor = screen->handle()->cursor())
            cursor->setOverrideCursor(c);
    }
}